

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O3

void __thiscall bloaty::dwarf::CU::ReadTopLevelDIE(CU *this,InfoReader *reader)

{
  ushort uVar1;
  pointer pAVar2;
  ulong uVar3;
  Abbrev *pAVar4;
  uint64_t uVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  const_iterator __begin2;
  pointer pAVar8;
  const_iterator __end2;
  string_view sVar9;
  optional<unsigned_long> stmt_list;
  DIEReader die_reader;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_b8;
  undefined8 local_a8;
  mapped_type *local_a0;
  uint64_t local_98;
  byte local_90;
  InfoReader *local_88;
  long *local_80 [2];
  long local_70 [2];
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_60;
  ulong local_50;
  DIEReader local_48;
  
  local_48.remaining_._M_len = (this->data_)._M_len;
  local_48.remaining_._M_str = (this->data_)._M_str;
  local_48.depth_ = 0;
  pAVar4 = DIEReader::ReadCode(&local_48,this);
  local_90 = 0;
  (this->unit_name_)._M_string_length = 0;
  *(this->unit_name_)._M_dataplus._M_p = '\0';
  pAVar8 = (pAVar4->attr).
           super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (pAVar4->attr).
           super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar8 != pAVar2) {
    local_a0 = &this->unit_name_;
    local_88 = reader;
    do {
      uVar1 = pAVar8->name;
      AttrValue::ParseAttr((AttrValue *)&local_60.string_,this,pAVar8->form,&local_48.remaining_);
      local_a8 = local_50;
      uVar3 = local_a8;
      local_b8.uint_ = local_60.uint_;
      local_b8.string_._M_str = local_60.string_._M_str;
      local_a8._4_4_ = (uint)(local_50 >> 0x20);
      local_a8._0_2_ = (short)local_50;
      local_a8 = uVar3;
      if (uVar1 < 0x73) {
        if (uVar1 == 3) {
          if ((local_a8._4_4_ & 0xfffffffd) == 1) {
            sVar9 = AttrValue::GetString((AttrValue *)&local_b8.string_,this);
            local_80[0] = local_70;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_80,sVar9._M_str,sVar9._M_str + sVar9._M_len);
            std::__cxx11::string::operator=((string *)local_a0,(string *)local_80);
            uVar3 = local_a8;
            if (local_80[0] != local_70) {
              operator_delete(local_80[0],local_70[0] + 1);
              uVar3 = local_a8;
            }
          }
        }
        else if (uVar1 == 0x10) {
          if ((short)local_a8 == 0x17) {
            local_98 = AttrValue::GetUint((AttrValue *)&local_b8.string_,this);
            local_90 = 1;
            uVar3 = local_a8;
          }
        }
        else if ((uVar1 == 0x72) && ((short)local_a8 == 0x17)) {
          uVar5 = AttrValue::GetUint((AttrValue *)&local_b8.string_,this);
          this->str_offsets_base_ = uVar5;
          uVar3 = local_a8;
        }
      }
      else if (uVar1 < 0x2131) {
        if (uVar1 == 0x73) {
LAB_001bc765:
          if ((short)local_a8 == 0x17) {
            uVar5 = AttrValue::GetUint((AttrValue *)&local_b8.string_,this);
            this->addr_base_ = uVar5;
            uVar3 = local_a8;
          }
        }
        else if ((uVar1 == 0x74) && ((short)local_a8 == 0x17)) {
          uVar5 = AttrValue::GetUint((AttrValue *)&local_b8.string_,this);
          this->range_lists_base_ = uVar5;
          uVar3 = local_a8;
        }
      }
      else if (uVar1 == 0x2131) {
        if ((local_50 & 0xfffffffd00000000) == 0) {
          uVar5 = AttrValue::GetUint((AttrValue *)&local_b8.string_,this);
          this->dwo_id_ = uVar5;
          uVar3 = local_a8;
        }
      }
      else if (uVar1 == 0x2133) goto LAB_001bc765;
      local_a8 = uVar3;
      pAVar8 = pAVar8 + 1;
    } while (pAVar8 != pAVar2);
    if ((local_90 & 1) != 0) {
      if ((this->unit_name_)._M_string_length == 0) {
        iVar7 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(local_88->stmt_list_map_)._M_h,&local_98);
        pmVar6 = local_a0;
        if (iVar7.
            super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          return;
        }
      }
      else {
        pmVar6 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_88->stmt_list_map_,&local_98);
      }
      std::__cxx11::string::_M_assign((string *)pmVar6);
    }
  }
  return;
}

Assistant:

void CU::ReadTopLevelDIE(InfoReader& reader) {
  DIEReader die_reader = GetDIEReader();
  const auto* abbrev = die_reader.ReadCode(*this);
  absl::optional<uint64_t> stmt_list;
  unit_name_.clear();
  die_reader.ReadAttributes(
      *this, abbrev, [this, &stmt_list](uint16_t tag, dwarf::AttrValue value) {
        switch (tag) {
          case DW_AT_name:
            if (value.IsString()) {
              unit_name_ = std::string(value.GetString(*this));
            }
            break;
          case DW_AT_stmt_list:
            if (value.form() == DW_FORM_sec_offset) {
              stmt_list = value.GetUint(*this);
            }
            break;
          case DW_AT_addr_base:
          case DW_AT_GNU_addr_base:
            if (value.form() == DW_FORM_sec_offset) {
              addr_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_str_offsets_base:
            if (value.form() == DW_FORM_sec_offset) {
              str_offsets_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_rnglists_base:
            if (value.form() == DW_FORM_sec_offset) {
              range_lists_base_ = value.GetUint(*this);
            }
            break;
          case DW_AT_GNU_dwo_id:
            if (value.IsUint()) {
              dwo_id_ = value.GetUint(*this);
            }
        }
      });

  if (stmt_list) {
    if (unit_name_.empty()) {
      auto iter = reader.stmt_list_map_.find(*stmt_list);
      if (iter != reader.stmt_list_map_.end()) {
        unit_name_ = iter->second;
      }
    } else {
      (reader.stmt_list_map_)[*stmt_list] = unit_name_;
    }
  }
}